

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expansion.cpp
# Opt level: O0

void expand_(PadParseMessageBlock *m,int pad_parse_block_count,ExpansionBlock *ws,int *ws_count)

{
  bool __x;
  unsigned_long uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  ExpansionBlock EVar5;
  int local_154;
  _Base_bitset<1UL> _Stack_150;
  int i_2;
  _Base_bitset<1UL> local_148;
  _Base_bitset<1UL> local_140;
  _Base_bitset<1UL> local_138;
  _Base_bitset<1UL> local_130;
  _Base_bitset<1UL> local_128;
  _Base_bitset<1UL> local_120;
  _Base_bitset<1UL> local_118;
  _Base_bitset<1UL> local_110;
  _Base_bitset<1UL> local_108;
  _Base_bitset<1UL> local_100;
  _Base_bitset<1UL> local_f8;
  _Base_bitset<1UL> local_f0;
  _Base_bitset<1UL> local_e8;
  _Base_bitset<1UL> local_e0;
  _Base_bitset<1UL> local_d8;
  _Base_bitset<1UL> local_d0;
  int local_c8;
  int i_1;
  reference local_b8;
  reference local_a8;
  int local_98;
  int local_94;
  int j_1;
  int i;
  PadParseMessageBlock mi;
  _Base_bitset<1UL> _Stack_48;
  int j;
  ExpansionBlock s0;
  ExpansionBlock s1;
  ExpansionBlock eb;
  int ws_iterator;
  int *ws_count_local;
  ExpansionBlock *ws_local;
  int pad_parse_block_count_local;
  PadParseMessageBlock *m_local;
  
  *ws_count = pad_parse_block_count << 6;
  eb.super__Base_bitset<1UL>._M_w._4_4_ = 0;
  std::bitset<32UL>::bitset(&s1);
  std::bitset<32UL>::bitset(&s0);
  std::bitset<32UL>::bitset((bitset<32UL> *)&stack0xffffffffffffffb8);
  for (mi.super__Base_bitset<8UL>._M_w[7]._4_4_ = 0;
      mi.super__Base_bitset<8UL>._M_w[7]._4_4_ < pad_parse_block_count;
      mi.super__Base_bitset<8UL>._M_w[7]._4_4_ = mi.super__Base_bitset<8UL>._M_w[7]._4_4_ + 1) {
    memcpy(&j_1,m + mi.super__Base_bitset<8UL>._M_w[7]._4_4_,0x40);
    for (local_94 = 0; local_94 < 0x10; local_94 = local_94 + 1) {
      for (local_98 = 0; local_98 < 0x20; local_98 = local_98 + 1) {
        std::bitset<512UL>::operator[]((bitset<512UL> *)&local_a8,(size_t)&j_1);
        __x = std::bitset::reference::operator_cast_to_bool((reference *)&local_a8);
        std::bitset<32UL>::operator[]((bitset<32UL> *)&local_b8,(size_t)&s1);
        std::bitset<32UL>::reference::operator=(&local_b8,__x);
        std::bitset<32UL>::reference::~reference(&local_b8);
        std::bitset<512UL>::reference::~reference(&local_a8);
      }
      ws[eb.super__Base_bitset<1UL>._M_w._4_4_ + local_94].super__Base_bitset<1UL>._M_w =
           (_WordT)s1.super__Base_bitset<1UL>._M_w;
    }
    for (local_c8 = 0x10; local_c8 < 0x40; local_c8 = local_c8 + 1) {
      local_e8._M_w =
           ws[eb.super__Base_bitset<1UL>._M_w._4_4_ * 0x40 + local_c8 + -0xc].
           super__Base_bitset<1UL>._M_w;
      local_e0._M_w = (_WordT)rot(0x11,local_e8._M_w);
      local_f8._M_w =
           ws[eb.super__Base_bitset<1UL>._M_w._4_4_ * 0x40 + local_c8 + -0xc].
           super__Base_bitset<1UL>._M_w;
      local_f0._M_w = (_WordT)rot(0xe,local_f8._M_w);
      local_d8._M_w = (_WordT)std::operator^((bitset<32UL> *)&local_e0,(bitset<32UL> *)&local_f0);
      local_108._M_w =
           ws[eb.super__Base_bitset<1UL>._M_w._4_4_ * 0x40 + local_c8 + -0xc].
           super__Base_bitset<1UL>._M_w;
      local_100._M_w = (_WordT)shf(0xc,local_108._M_w);
      local_d0._M_w = (_WordT)std::operator^((bitset<32UL> *)&local_d8,(bitset<32UL> *)&local_100);
      local_128._M_w =
           ws[eb.super__Base_bitset<1UL>._M_w._4_4_ * 0x40 + local_c8 + -1].super__Base_bitset<1UL>.
           _M_w;
      _Stack_48._M_w = local_d0._M_w;
      local_120._M_w = (_WordT)rot(9,local_128._M_w);
      local_138._M_w =
           ws[eb.super__Base_bitset<1UL>._M_w._4_4_ * 0x40 + local_c8 + -1].super__Base_bitset<1UL>.
           _M_w;
      local_130._M_w = (_WordT)rot(0x13,local_138._M_w);
      local_118._M_w = (_WordT)std::operator^((bitset<32UL> *)&local_120,(bitset<32UL> *)&local_130)
      ;
      local_148._M_w =
           ws[eb.super__Base_bitset<1UL>._M_w._4_4_ * 0x40 + local_c8 + -1].super__Base_bitset<1UL>.
           _M_w;
      local_140._M_w = (_WordT)shf(9,local_148._M_w);
      local_110._M_w = (_WordT)std::operator^((bitset<32UL> *)&local_118,(bitset<32UL> *)&local_140)
      ;
      s0.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_110._M_w;
      uVar1 = std::bitset<32UL>::to_ulong(&s0);
      uVar2 = std::bitset<32UL>::to_ulong
                        (ws + (eb.super__Base_bitset<1UL>._M_w._4_4_ * 0x40 + local_c8 + -6));
      uVar3 = std::bitset<32UL>::to_ulong((bitset<32UL> *)&stack0xffffffffffffffb8);
      uVar4 = std::bitset<32UL>::to_ulong
                        (ws + (eb.super__Base_bitset<1UL>._M_w._4_4_ * 0x40 + local_c8 + -0xf));
      std::bitset<32UL>::bitset
                ((bitset<32UL> *)&stack0xfffffffffffffeb0,uVar1 + uVar2 + uVar3 + uVar4);
      s1.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)_Stack_150._M_w;
      ws[eb.super__Base_bitset<1UL>._M_w._4_4_ + local_c8].super__Base_bitset<1UL>._M_w =
           _Stack_150._M_w;
    }
    for (local_154 = 0; local_154 < 0x40; local_154 = local_154 + 1) {
      EVar5 = permutationBox((ExpansionBlock)
                             ws[eb.super__Base_bitset<1UL>._M_w._4_4_ + local_154].
                             super__Base_bitset<1UL>._M_w);
      ws[eb.super__Base_bitset<1UL>._M_w._4_4_ + local_154].super__Base_bitset<1UL>._M_w =
           (_WordT)EVar5.super__Base_bitset<1UL>._M_w;
    }
    eb.super__Base_bitset<1UL>._M_w._4_4_ = eb.super__Base_bitset<1UL>._M_w._4_4_ + 1;
  }
  return;
}

Assistant:

void expand_(PadParseMessageBlock *m, int pad_parse_block_count, ExpansionBlock *ws, int &ws_count)
{
    ws_count = 64 * pad_parse_block_count;
    int ws_iterator = 0;
    ExpansionBlock eb, s1, s0;

    for (int j = 0; j < pad_parse_block_count; ++j) {
        PadParseMessageBlock mi = m[j];

        for (int i = 0; i < EXPANSION_CHUNK_NUM; i++) { // making first 16 Wt
            for (int j = 0; j < EXPANSION_BLOCK_SIZE; j++) {
                eb[EXPANSION_BLOCK_SIZE - 1 - j] = mi[PAD_PARSE_BLOCK_SIZE - 1 - (i * 32) - j];
            }

            ws[ws_iterator + i] = eb;
        }

        for (int i = 16; i < EXPANSION_BLOCK_COUNT_IN_SET; i++) { // making other 64 Wt
            s0 = rot(17, ws[64 * ws_iterator + i - 12]) ^ rot(14, ws[64 * ws_iterator + i - 12]) ^ shf(12, ws[64 * ws_iterator + i - 12]);
            s1 = rot(9, ws[64 * ws_iterator + i - 1]) ^ rot(19, ws[64 * ws_iterator + i - 1]) ^ shf(9, ws[64 * ws_iterator + i - 1]);
            eb = s1.to_ulong() + ws[64 * ws_iterator + i - 6].to_ulong() + s0.to_ulong() + ws[64 * ws_iterator + i - 15].to_ulong();

            ws[ws_iterator + i] = eb;
        }

        for (int i = 0; i < EXPANSION_BLOCK_COUNT_IN_SET; i++) { // permuting the blocks
            ws[ws_iterator + i] = permutationBox(ws[ws_iterator + i]);
        }

        ws_iterator++;
    }
}